

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  secp256k1_gej pj;
  secp256k1_gej local_a8;
  
  secp256k1_scalar_set_b32(seckey_scalar,seckey,(int *)&local_a8);
  uVar2 = seckey_scalar->d[1];
  uVar3 = seckey_scalar->d[2];
  uVar4 = seckey_scalar->d[3];
  bVar5 = ((uVar3 != 0 || uVar4 != 0) || (uVar2 != 0 || seckey_scalar->d[0] != 0)) &&
          (uint)local_a8.x.n[0] == 0;
  local_a8.x.n[0]._0_4_ = bVar5 ^ 1;
  uVar1 = (long)(int)(uint)local_a8.x.n[0] - 1;
  seckey_scalar->d[0] = (ulong)(uint)local_a8.x.n[0] | seckey_scalar->d[0] & uVar1;
  seckey_scalar->d[1] = uVar2 & uVar1;
  seckey_scalar->d[2] = uVar3 & uVar1;
  seckey_scalar->d[3] = uVar1 & uVar4;
  secp256k1_ecmult_gen(ecmult_gen_ctx,&local_a8,seckey_scalar);
  secp256k1_ge_set_gej(p,&local_a8);
  return (uint)bVar5;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    return ret;
}